

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<const_QGraphicsItem_*,_QMap<int,_QVariant>_>_>::freeData
          (Span<QHashPrivate::Node<const_QGraphicsItem_*,_QMap<int,_QVariant>_>_> *this)

{
  long lVar1;
  
  if (this->entries != (Entry *)0x0) {
    for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
      if (this->offsets[lVar1] != 0xff) {
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2
                  ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    *)(this->entries[this->offsets[lVar1]].storage.data + 8));
      }
    }
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }